

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * file_makename(lemon *lemp,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  char *cp;
  char *name;
  char *suffix_local;
  lemon *lemp_local;
  
  sVar1 = strlen(lemp->outbasefilename);
  sVar2 = strlen(suffix);
  __dest = (char *)malloc((long)((int)sVar1 + (int)sVar2 + 5));
  if (__dest == (char *)0x0) {
    fprintf(_stderr,"Can\'t allocate space for a filename.\n");
    exit(1);
  }
  strcpy(__dest,lemp->outbasefilename);
  pcVar3 = strrchr(__dest,0x2e);
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
  }
  strcat(__dest,suffix);
  return __dest;
}

Assistant:

PRIVATE char *file_makename(struct lemon *lemp, const char *suffix)
{
  char *name;
  char *cp;

  name = (char*)malloc( lemonStrlen(lemp->outbasefilename) + lemonStrlen(suffix) + 5 );
  if( name==0 ){
    fprintf(stderr,"Can't allocate space for a filename.\n");
    exit(1);
  }
  strcpy(name,lemp->outbasefilename);
  cp = strrchr(name,'.');
  if( cp ) *cp = 0;
  strcat(name,suffix);
  return name;
}